

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O0

void __thiscall glslang::TPoolAllocator::~TPoolAllocator(TPoolAllocator *this)

{
  tHeader *ptVar1;
  tHeader *next_1;
  tHeader *next;
  TPoolAllocator *this_local;
  
  while (this->inUseList != (tHeader *)0x0) {
    ptVar1 = this->inUseList->nextPage;
    tHeader::~tHeader(this->inUseList);
    if (this->inUseList != (tHeader *)0x0) {
      operator_delete__(this->inUseList);
    }
    this->inUseList = ptVar1;
  }
  while (this->freeList != (tHeader *)0x0) {
    ptVar1 = this->freeList->nextPage;
    if (this->freeList != (tHeader *)0x0) {
      operator_delete__(this->freeList);
    }
    this->freeList = ptVar1;
  }
  std::
  vector<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
  ::~vector(&this->stack);
  return;
}

Assistant:

TPoolAllocator::~TPoolAllocator()
{
    while (inUseList) {
        tHeader* next = inUseList->nextPage;
        inUseList->~tHeader();
        delete [] reinterpret_cast<char*>(inUseList);
        inUseList = next;
    }

    //
    // Always delete the free list memory - it can't be being
    // (correctly) referenced, whether the pool allocator was
    // global or not.  We should not check the guard blocks
    // here, because we did it already when the block was
    // placed into the free list.
    //
    while (freeList) {
        tHeader* next = freeList->nextPage;
        delete [] reinterpret_cast<char*>(freeList);
        freeList = next;
    }
}